

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O3

void __thiscall
ktx::DiffEnum<_khr_df_primaries_e>::DiffEnum
          (DiffEnum<_khr_df_primaries_e> *this,string_view textHeaderIn,string_view jsonPathIn,
          optional<int> *value1,optional<int> *value2,function<const_char_*(unsigned_long)> *strFunc
          )

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 uVar5;
  undefined1 uVar6;
  undefined4 uVar7;
  undefined1 uVar8;
  char *pcVar9;
  _Optional_payload_base<_khr_df_primaries_e> _Var10;
  _Optional_payload_base<_khr_df_primaries_e> _Var11;
  unsigned_long local_28;
  
  bVar1 = (value1->super__Optional_base<int,_true,_true>)._M_payload.
          super__Optional_payload_base<int>._M_engaged;
  iVar3 = (value1->super__Optional_base<int,_true,_true>)._M_payload.
          super__Optional_payload_base<int>._M_payload._M_value;
  uVar5 = (value1->super__Optional_base<int,_true,_true>)._M_payload.
          super__Optional_payload_base<int>._M_payload;
  uVar6 = (value1->super__Optional_base<int,_true,_true>)._M_payload.
          super__Optional_payload_base<int>._M_engaged;
  _Var11._M_engaged = (bool)uVar6;
  _Var11._M_payload = (_Storage<_khr_df_primaries_e,_true>)uVar5;
  bVar2 = (value2->super__Optional_base<int,_true,_true>)._M_payload.
          super__Optional_payload_base<int>._M_engaged;
  iVar4 = (value2->super__Optional_base<int,_true,_true>)._M_payload.
          super__Optional_payload_base<int>._M_payload._M_value;
  uVar7 = (value2->super__Optional_base<int,_true,_true>)._M_payload.
          super__Optional_payload_base<int>._M_payload;
  uVar8 = (value2->super__Optional_base<int,_true,_true>)._M_payload.
          super__Optional_payload_base<int>._M_engaged;
  _Var10._M_engaged = (bool)uVar8;
  _Var10._M_payload = (_Storage<_khr_df_primaries_e,_true>)uVar7;
  (this->super_DiffBase<_khr_df_primaries_e>).textHeader._M_len = textHeaderIn._M_len;
  (this->super_DiffBase<_khr_df_primaries_e>).textHeader._M_str = textHeaderIn._M_str;
  (this->super_DiffBase<_khr_df_primaries_e>).jsonPath._M_len = jsonPathIn._M_len;
  (this->super_DiffBase<_khr_df_primaries_e>).jsonPath._M_str = jsonPathIn._M_str;
  (this->super_DiffBase<_khr_df_primaries_e>).different =
       (bool)(iVar3 != iVar4 & bVar1 | bVar1 != bVar2);
  _Var11._5_3_ = 0;
  (this->super_DiffBase<_khr_df_primaries_e>).values[0].
  super__Optional_base<_khr_df_primaries_e,_true,_true>._M_payload.
  super__Optional_payload_base<_khr_df_primaries_e> = _Var11;
  _Var10._5_3_ = 0;
  (this->super_DiffBase<_khr_df_primaries_e>).values[1].
  super__Optional_base<_khr_df_primaries_e,_true,_true>._M_payload.
  super__Optional_payload_base<_khr_df_primaries_e> = _Var10;
  (this->super_DiffBase<_khr_df_primaries_e>)._vptr_DiffBase =
       (_func_int **)&PTR_value_abi_cxx11__0025c578;
  (this->super_DiffBase<_khr_df_primaries_e>).field_0x39 = 0;
  this->enumNames[0] = (char *)0x0;
  this->enumNames[1] = (char *)0x0;
  if ((value1->super__Optional_base<int,_true,_true>)._M_payload.super__Optional_payload_base<int>.
      _M_engaged == true) {
    local_28 = 0;
    if ((strFunc->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0013b229;
    pcVar9 = (*strFunc->_M_invoker)((_Any_data *)strFunc,&local_28);
    this->enumNames[0] = pcVar9;
  }
  if ((value2->super__Optional_base<int,_true,_true>)._M_payload.super__Optional_payload_base<int>.
      _M_engaged == true) {
    local_28 = 1;
    if ((strFunc->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_0013b229:
      std::__throw_bad_function_call();
    }
    pcVar9 = (*strFunc->_M_invoker)((_Any_data *)strFunc,&local_28);
    this->enumNames[1] = pcVar9;
  }
  return;
}

Assistant:

DiffEnum(const std::string_view textHeaderIn, const std::string_view jsonPathIn,
        const std::optional<int32_t>& value1, const std::optional<int32_t>& value2,
        const std::function<const char*(std::size_t)>& strFunc)
        : DiffBase<T>(textHeaderIn, jsonPathIn,
            value1.has_value() ? T(*value1) : std::optional<T>(),
            value2.has_value() ? T(*value2) : std::optional<T>()) {
        if (value1.has_value()) enumNames[0] = strFunc(0);
        if (value2.has_value()) enumNames[1] = strFunc(1);
    }